

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O2

_Bool effect_handler_LASH(effect_handler_context_t *context)

{
  long *plVar1;
  wchar_t wVar2;
  wchar_t typ;
  _Bool _Var3;
  uint8_t diameter_of_source;
  _Bool _Var4;
  wchar_t dam;
  wchar_t rad;
  int iVar5;
  monster *mon;
  monster *pmVar6;
  loc finish;
  monster_race *pmVar7;
  monster_blow *pmVar8;
  long lVar9;
  ulong uVar10;
  random_value v;
  source origin;
  
  _Var3 = false;
  dam = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  wVar2 = context->radius;
  loc(-1,-1);
  if ((context->origin).what == SRC_MONSTER) {
    mon = cave_monster(cave,(context->origin).which.monster);
    pmVar6 = monster_target_monster((effect_handler_context_t_conflict *)context);
    if (pmVar6 == (monster *)0x0) {
      _Var3 = monster_is_decoyed(mon);
      if (_Var3) {
        finish = cave_find_decoy(cave);
      }
      else {
        finish.x = (player->grid).x;
        finish.y = (player->grid).y;
      }
    }
    else {
      finish.x = (pmVar6->grid).x;
      finish.y = (pmVar6->grid).y;
    }
    rad = (uint)z_info->max_range;
    if (wVar2 < (int)(uint)z_info->max_range) {
      rad = wVar2;
    }
    pmVar7 = mon->race;
    pmVar8 = pmVar7->blow;
    typ = pmVar8->effect->lash_type;
    lVar9 = 0;
    uVar10 = 0;
    do {
      if (z_info->mon_blows_max <= uVar10) break;
      v._8_8_ = *(undefined8 *)((long)&(pmVar8->dice).sides + lVar9);
      v._0_8_ = *(undefined8 *)((long)&(pmVar8->dice).base + lVar9);
      iVar5 = randcalc(v,pmVar7->level,RANDOMISE);
      dam = dam + iVar5 / (int)(2 - (uint)(lVar9 == 0));
      pmVar7 = mon->race;
      pmVar8 = pmVar7->blow;
      uVar10 = uVar10 + 1;
      plVar1 = (long *)((long)&pmVar8->next + lVar9);
      lVar9 = lVar9 + 0x30;
    } while (*plVar1 != 0);
    if (dam == L'\0') {
      _Var3 = false;
    }
    else {
      diameter_of_source = '\x19';
      if (wVar2 < L'\x19') {
        diameter_of_source = (uint8_t)wVar2;
      }
      origin._4_4_ = 0;
      origin.what = (context->origin).what;
      origin.which.trap = (context->origin).which.trap;
      _Var4 = project(origin,rad,finish,dam,typ,L'౰',L'\0',diameter_of_source,context->obj);
      _Var3 = true;
      if (_Var4) {
        context->ident = true;
      }
    }
  }
  return _Var3;
}

Assistant:

bool effect_handler_LASH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int rad = context->radius;

	int flg = PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL | PROJECT_ARC;
	int type;

	struct loc target = loc(-1, -1);

	/* Diameter of source is the same as the radius, so the effect is
	 * essentially full strength for its entire length. */
	int diameter_of_source = rad;

	/* Monsters only */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		int i;

		flg |= PROJECT_PLAY;

		/* Target player or monster? */
		if (t_mon) {
			target = t_mon->grid;
		} else {
			if (monster_is_decoyed(mon)) {
				target = cave_find_decoy(cave);
			} else {
				target = player->grid;
			}
		}

		/* Paranoia */
		if (rad > z_info->max_range) rad = z_info->max_range;

		/* Get the type (default is PROJ_MISSILE) */
		type = mon->race->blow[0].effect->lash_type;

		/* Scan through all blows for damage */
		for (i = 0; i < z_info->mon_blows_max; i++) {
			/* Extract the attack infomation */
			random_value dice = mon->race->blow[i].dice;

			/* Full damage of first blow, plus half damage of others */
			dam += randcalc(dice, mon->race->level, RANDOMISE) / (i ? 2 : 1);
			if (!mon->race->blow[i].next) break;
		}

		/* No damaging blows */
		if (!dam) return false;
	} else {
		return false;
	}

	/* Check bounds */
	if (diameter_of_source > 25) {
		diameter_of_source = 25;
	}

	/* Lash the target */
	if (project(context->origin, rad, target, dam, type, flg, 0,
				diameter_of_source, context->obj)) {
		context->ident = true;
	}

	return true;
}